

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void __thiscall argo::token::token(token *this,token *other)

{
  this->_vptr_token = (_func_int **)&PTR__token_0011bd68;
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  (this->m_raw_value)._M_string_length = 0;
  (this->m_raw_value).field_2._M_local_buf[0] = '\0';
  operator=(this,other);
  return;
}

Assistant:

token::token(token &&other)
{
    *this = other;
}